

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ber_tlv_tag.c
# Opt level: O0

ssize_t ber_fetch_tag(void *ptr,size_t size,ber_tlv_tag_t *tag_r)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint oct;
  size_t skipped;
  ber_tlv_tag_t tclass;
  ber_tlv_tag_t val;
  ber_tlv_tag_t *tag_r_local;
  size_t size_local;
  void *ptr_local;
  ssize_t local_8;
  
  if (size == 0) {
    local_8 = 0;
  }
  else {
    uVar2 = (uint)(*ptr >> 6);
    uVar3 = *ptr & 0x1f;
    if (uVar3 == 0x1f) {
      val = 0;
      ptr_local = (void *)((long)ptr + 1);
      for (skipped = 2; skipped <= size; skipped = skipped + 1) {
        bVar1 = *ptr_local;
        if ((bVar1 & 0x80) == 0) {
          *tag_r = (val << 7 | (uint)bVar1) << 2 | uVar2;
          return skipped;
        }
        uVar3 = val << 7;
        val = uVar3 | bVar1 & 0x7f;
        if (uVar3 >> 0x17 != 0) {
          return -1;
        }
        ptr_local = (void *)((long)ptr_local + 1);
      }
      local_8 = 0;
    }
    else {
      *tag_r = uVar3 << 2 | uVar2;
      local_8 = 1;
    }
  }
  return local_8;
}

Assistant:

ssize_t
ber_fetch_tag(const void *ptr, size_t size, ber_tlv_tag_t *tag_r) {
	ber_tlv_tag_t val;
	ber_tlv_tag_t tclass;
	size_t skipped;

	if(size == 0)
		return 0;

	val = *(const uint8_t *)ptr;
	tclass = (val >> 6);
	if((val &= 0x1F) != 0x1F) {
		/*
		 * Simple form: everything encoded in a single octet.
		 * Tag Class is encoded using two least significant bits.
		 */
		*tag_r = (val << 2) | tclass;
		return 1;
	}

	/*
	 * Each octet contains 7 bits of useful information.
	 * The MSB is 0 if it is the last octet of the tag.
	 */
	for(val = 0, ptr = ((const char *)ptr) + 1, skipped = 2;
			skipped <= size;
				ptr = ((const char *)ptr) + 1, skipped++) {
		unsigned int oct = *(const uint8_t *)ptr;
		if(oct & 0x80) {
			val = (val << 7) | (oct & 0x7F);
			/*
			 * Make sure there are at least 9 bits spare
			 * at the MS side of a value.
			 */
			if(val >> ((8 * sizeof(val)) - 9)) {
				/*
				 * We would not be able to accomodate
				 * any more tag bits.
				 */
				return -1;
			}
		} else {
			val = (val << 7) | oct;
			*tag_r = (val << 2) | tclass;
			return skipped;
		}
	}

	return 0;	/* Want more */
}